

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_dealloc_unittest.cc
# Opt level: O3

void AllocStuff(void)

{
  void *pvVar1;
  void *pvVar2;
  int i;
  long lVar3;
  
  pvVar1 = operator_new__(0x2000);
  lVar3 = 0;
  do {
    pvVar2 = malloc(0x400);
    *(void **)((long)pvVar1 + lVar3 * 8) = pvVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  lVar3 = 0;
  do {
    free(*(void **)((long)pvVar1 + lVar3 * 8));
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  operator_delete__(pvVar1);
  return;
}

Assistant:

static void AllocStuff() {
  do_early_stuff();

  std::unique_ptr<void*[]> objects{new void*[kNumObjects]};

  for (int i = 0; i < kNumObjects; i++) {
    objects[i] = malloc(kObjectSize);
  }
  for (int i = 0; i < kNumObjects; i++) {
    free(objects[i]);
  }
}